

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,DataReader *dr)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ParamDictPrivate *pPVar6;
  long lVar7;
  bool bVar8;
  float fVar9;
  int id;
  int len;
  char vstr [16];
  uint local_58;
  int local_54;
  DataReader *local_50;
  char local_48 [24];
  
  clear(this);
  local_58 = 0;
  local_50 = dr;
  iVar2 = (*dr->_vptr_DataReader[2])(dr,"%d=");
  do {
    if (iVar2 != 1) {
      return 0;
    }
    if ((int)local_58 < -0x5b03) {
      iVar2 = -local_58;
      bVar8 = local_58 < 0xffffa4dd;
      local_58 = iVar2 - 0x5b04;
      if (bVar8) goto LAB_001712f0;
      local_54 = 0;
      iVar2 = (*local_50->_vptr_DataReader[2])(local_50,"%d",&local_54);
      if (iVar2 != 1) {
        load_param();
        return -1;
      }
      Mat::create(&this->d->params[(int)local_58].v,local_54,4,(Allocator *)0x0);
      if (0 < local_54) {
        lVar7 = 0;
        lVar5 = 0;
        do {
          iVar2 = (*local_50->_vptr_DataReader[2])(local_50,",%15[^,\n ]",local_48);
          if (iVar2 != 1) {
            load_param();
            goto LAB_001712c8;
          }
          bVar8 = vstr_is_float(local_48);
          pPVar6 = this->d;
          lVar4 = (long)(int)local_58;
          pvVar1 = pPVar6->params[lVar4].v.data;
          if (bVar8) {
            fVar9 = vstr_to_float(local_48);
            *(float *)((long)pvVar1 + lVar7) = fVar9;
            iVar2 = 6;
          }
          else {
            iVar2 = __isoc99_sscanf(local_48,"%d",(long)pvVar1 + lVar7);
            if (iVar2 != 1) {
              load_param();
              goto LAB_001712c8;
            }
            pPVar6 = this->d;
            lVar4 = (long)(int)local_58;
            iVar2 = 5;
          }
          pPVar6->params[lVar4].type = iVar2;
          lVar5 = lVar5 + 1;
          lVar7 = lVar7 + 4;
        } while (lVar5 < local_54);
      }
    }
    else {
      if (0x1f < (int)local_58) {
LAB_001712f0:
        load_param((ParamDict *)(ulong)local_58);
        return -1;
      }
      iVar2 = (*local_50->_vptr_DataReader[2])(local_50,"%15s",local_48);
      if (iVar2 != 1) {
        load_param();
LAB_001712c8:
        fputc(10,_stderr);
        return -1;
      }
      bVar8 = vstr_is_float(local_48);
      if (bVar8) {
        fVar9 = vstr_to_float(local_48);
        this->d->params[(int)local_58].field_1.f = fVar9;
        iVar3 = 3;
      }
      else {
        iVar2 = __isoc99_sscanf(local_48,"%d",&this->d->params[(int)local_58].field_1);
        iVar3 = 2;
        if (iVar2 != 1) {
          load_param();
          goto LAB_001712c8;
        }
      }
      this->d->params[(int)local_58].type = iVar3;
    }
    iVar2 = (*local_50->_vptr_DataReader[2])(local_50,"%d=",&local_58);
  } while( true );
}

Assistant:

int ParamDict::load_param(const DataReader& dr)
{
    clear();

    //     0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (dr.scan("%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_array)
        {
            int len = 0;
            int nscan = dr.scan("%d", &len);
            if (nscan != 1)
            {
                NCNN_LOGE("ParamDict read array length failed");
                return -1;
            }

            d->params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = dr.scan(",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict read array element failed");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = d->params[id].v;
                    ptr[j] = vstr_to_float(vstr);
                }
                else
                {
                    int* ptr = d->params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                    if (nscan != 1)
                    {
                        NCNN_LOGE("ParamDict parse array element failed");
                        return -1;
                    }
                }

                d->params[id].type = is_float ? 6 : 5;
            }
        }
        else
        {
            char vstr[16];
            int nscan = dr.scan("%15s", vstr);
            if (nscan != 1)
            {
                NCNN_LOGE("ParamDict read value failed");
                return -1;
            }

            bool is_float = vstr_is_float(vstr);

            if (is_float)
            {
                d->params[id].f = vstr_to_float(vstr);
            }
            else
            {
                nscan = sscanf(vstr, "%d", &d->params[id].i);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict parse value failed");
                    return -1;
                }
            }

            d->params[id].type = is_float ? 3 : 2;
        }
    }

    return 0;
}